

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_corpus.c
# Opt level: O2

int enum_corpus(lexicon_t *lex,model_def_t *mdef,uint32 *cnt,cnt_fn_t cnt_fn)

{
  acmod_set_t *acmod_set;
  uint16 *seg_00;
  uint32 n_phone_00;
  int32 n_frame_00;
  int iVar1;
  char **ptr;
  acmod_id_t *phone;
  char *pcVar2;
  char *fmt;
  uint uVar3;
  long lStackY_90;
  uint16 *seg;
  char *trans;
  char *local_68;
  uint local_5c;
  uint32 n_phone;
  int32 n_frame;
  uint32 *local_50;
  lexicon_t *local_48;
  model_def_t *local_40;
  cnt_fn_t local_38;
  
  trans = (char *)0x0;
  seg = (uint16 *)0x0;
  local_68 = (char *)0x0;
  local_5c = 1;
  ptr = (char **)0x0;
  phone = (acmod_id_t *)0x0;
  local_50 = cnt;
  local_48 = lex;
  local_40 = mdef;
  local_38 = cnt_fn;
  do {
    uVar3 = local_5c / 1000;
    iVar1 = corpus_next_utt();
    if (iVar1 == 0) {
      if (trans != (char *)0x0) {
        free(trans);
        trans = (char *)0x0;
      }
      if (seg != (uint16 *)0x0) {
        free(seg);
        seg = (uint16 *)0x0;
      }
      if (ptr != (char **)0x0) {
        ckd_free(ptr);
      }
      if (phone != (acmod_id_t *)0x0) {
        ckd_free(phone);
      }
      if (local_68 != (char *)0x0) {
        ckd_free(local_68);
      }
      return 0;
    }
    if (trans != (char *)0x0) {
      free(trans);
      trans = (char *)0x0;
    }
    if (seg != (uint16 *)0x0) {
      free(seg);
      seg = (uint16 *)0x0;
    }
    if (ptr != (char **)0x0) {
      ckd_free(ptr);
    }
    if (phone != (acmod_id_t *)0x0) {
      ckd_free(phone);
    }
    if (local_68 != (char *)0x0) {
      ckd_free(local_68);
      local_68 = (char *)0x0;
    }
    if (uVar3 * -1000 + 1 + local_5c == 1) {
      fprintf(_stderr,"[%u] ");
      fflush(_stderr);
    }
    iVar1 = corpus_get_sent(&trans);
    if (iVar1 != 0) {
      pcVar2 = corpus_utt_brief_name();
      fmt = "Unable to read word transcript for %s\n";
      lStackY_90 = 0x6a;
LAB_001028b2:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
              ,lStackY_90,fmt,pcVar2);
      exit(1);
    }
    if (cnt_fn != phone_cnt) {
      iVar1 = corpus_get_seg(&seg,&n_frame);
      if (iVar1 != 0) {
        pcVar2 = corpus_utt_brief_name();
        fmt = "Unable to read Viterbi state segmentation for %s\n";
        lStackY_90 = 0x70;
        goto LAB_001028b2;
      }
    }
    uVar3 = str2words(trans,(char **)0x0,0);
    ptr = (char **)__ckd_calloc__((ulong)uVar3,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
                                  ,0x75);
    str2words(trans,ptr,uVar3);
    phone = mk_phone_list(&local_68,&n_phone,ptr,uVar3,lex);
    n_frame_00 = n_frame;
    n_phone_00 = n_phone;
    seg_00 = seg;
    if (phone == (acmod_id_t *)0x0) {
      pcVar2 = corpus_utt();
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
              ,0x7a,"Unable to produce phone sequence; skipping utt %s\n",pcVar2);
    }
    else {
      if (cnt_fn != phone_cnt) {
        acmod_set = mdef->acmod_set;
        pcVar2 = corpus_utt();
        cnt_fn = local_38;
        mdef = local_40;
        lex = local_48;
        iVar1 = ck_seg(acmod_set,phone,n_phone_00,seg_00,n_frame_00,pcVar2);
        if (iVar1 != 0) goto LAB_001027f1;
      }
      (*cnt_fn)(local_50,mdef,seg,n_frame,phone,local_68,n_phone);
    }
LAB_001027f1:
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

int
enum_corpus(lexicon_t *lex,
	    model_def_t *mdef,
	    uint32 *cnt,
	    cnt_fn_t cnt_fn)
{
    uint32 tick_cnt = 0;
    char *trans = NULL;
    uint16 *seg = NULL;
    int32 n_frame;
    char **word = NULL;
    uint32 n_word;
    acmod_id_t *phone = NULL;
    uint32 n_phone;
    char *btw_mark = NULL;

    while (corpus_next_utt()) {
	if (trans) {
	    free(trans);
	    trans = NULL;
	}
	if (seg) {
	    free(seg);
	    seg = NULL;
	}
	if (word) {
	    ckd_free(word);
	    word = NULL;
	}
	if (phone) {
	    ckd_free(phone);
	    phone = NULL;
	}
	if (btw_mark) {
	    ckd_free(btw_mark);
	    btw_mark = NULL;
	}
	
	if ((++tick_cnt % 1000) == 0) {
	    fprintf(stderr, "[%u] ", tick_cnt);
	    fflush(stderr);
	}

	if (corpus_get_sent(&trans) != S3_SUCCESS) {
	    E_FATAL("Unable to read word transcript for %s\n", corpus_utt_brief_name());
	}

        if (cnt_fn != phone_cnt){
	    if (corpus_get_seg(&seg, &n_frame) != S3_SUCCESS) {
	        E_FATAL("Unable to read Viterbi state segmentation for %s\n",
		    corpus_utt_brief_name());
            }
	}
	    
	n_word = str2words(trans, NULL, 0);
	word = ckd_calloc(n_word, sizeof(char*));
	str2words(trans, word, n_word);

	phone = mk_phone_list(&btw_mark, &n_phone, word, n_word, lex);
	if (phone == NULL) {
	    E_WARN("Unable to produce phone sequence; skipping utt %s\n", corpus_utt());
	    continue;
	}

        if (cnt_fn != phone_cnt){
	    /* check to see whether the word transcript and dictionary entries
	       agree with the state segmentation */
	    if (ck_seg(mdef->acmod_set, phone, n_phone, seg, n_frame, corpus_utt()) != S3_SUCCESS) {
	        continue;
            }
	}

	(*cnt_fn)(cnt,				/* observation counts */
		  mdef,				/* model definitions */
		  seg, n_frame,			/* Viterbi state segmentation */
		  phone, btw_mark, n_phone);	/* list of phones */
    }

    /* free the per utterance data structures from the last utt */
    if (trans) {
	free(trans);
	trans = NULL;
    }
    if (seg) {
	free(seg);
	seg = NULL;
    }
    if (word) {
	ckd_free(word);
	word = NULL;
    }
    if (phone) {
	ckd_free(phone);
	phone = NULL;
    }
    if (btw_mark) {
	ckd_free(btw_mark);
	btw_mark = NULL;
    }
    
    return S3_SUCCESS;
}